

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O2

boolean can_advance(int skill,boolean speedy)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  boolean bVar4;
  int iVar5;
  
  iVar3 = u.weapon_slots;
  cVar1 = u.weapon_skills[skill].skill;
  if ((cVar1 == '\0') || (u.weapon_skills[skill].max_skill <= cVar1)) {
    return '\0';
  }
  if ((speedy == '\0') || (bVar4 = '\x01', flags.debug == '\0')) {
    uVar2 = 100 << (cVar1 - 1U & 0x1f);
    if (skill - 0x1eU < 7) {
      uVar2 = (int)cVar1 * (int)cVar1 * 0x14;
    }
    bVar4 = '\0';
    if ((uVar2 <= u.weapon_skills[skill].advance) && (u.skills_advanced < 0x3c)) {
      iVar5 = slots_required(skill);
      return iVar5 <= iVar3;
    }
  }
  return bVar4;
}

Assistant:

boolean can_advance(int skill, boolean speedy)
{
    return !P_RESTRICTED(skill)
	    && P_SKILL(skill) < P_MAX_SKILL(skill) && (
	    (wizard && speedy) || (P_ADVANCE(skill) >=
		(unsigned) practice_needed_to_advance(skill, P_SKILL(skill))
	    && u.skills_advanced < P_SKILL_LIMIT
	    && u.weapon_slots >= slots_required(skill)));
}